

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int sx_hashtbltval_find(sx_hashtbl_tval *tbl,uint32_t key)

{
  uint uVar1;
  uint local_34;
  int idx;
  uint32_t i;
  sx_hashtbl_tval *_tbl;
  uint32_t cnt;
  uint32_t h;
  uint32_t key_local;
  sx_hashtbl_tval *tbl_local;
  
  tbl_local._4_4_ = sx__fib_hash(key,tbl->_bitshift);
  if (tbl->keys[tbl_local._4_4_] != key) {
    tbl->_miss_cnt = tbl->_miss_cnt + 1;
    for (local_34 = 1; local_34 < (uint)tbl->capacity; local_34 = local_34 + 1) {
      uVar1 = (tbl_local._4_4_ + local_34) % (uint)tbl->capacity;
      tbl->_probe_cnt = tbl->_probe_cnt + 1;
      if (tbl->keys[(int)uVar1] == key) {
        return uVar1;
      }
    }
    tbl_local._4_4_ = 0xffffffff;
  }
  return tbl_local._4_4_;
}

Assistant:

int sx_hashtbltval_find(const sx_hashtbl_tval* tbl, uint32_t key)
{
    uint32_t h = sx__fib_hash(key, tbl->_bitshift);
    uint32_t cnt = (uint32_t)tbl->capacity;
    if (tbl->keys[h] == key) {
        return h;
    } else {
#if SX_CONFIG_HASHTBL_DEBUG
        sx_hashtbl_tval* _tbl = (sx_hashtbl_tval*)tbl;
        ++_tbl->_miss_cnt;
#endif
        // probe lineary in the keys array
        for (uint32_t i = 1; i < cnt; i++) {
            int idx = (h + i) % cnt;
#if SX_CONFIG_HASHTBL_DEBUG
            ++_tbl->_probe_cnt;
#endif
            if (tbl->keys[idx] == key)
                return idx;
        }

        return -1;    // Worst case: Not found!
    }
}